

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_DeleteReferences
               (UA_Server *server,UA_Session *session,UA_DeleteReferencesRequest *request,
               UA_DeleteReferencesResponse *response)

{
  UA_StatusCode UVar1;
  UA_StatusCode *pUVar2;
  uint local_70;
  uint local_68;
  uint local_64;
  ulong local_58;
  size_t i;
  UA_DeleteReferencesResponse *response_local;
  UA_DeleteReferencesRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_68 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = session->channel->connection->sockfd;
    }
    local_68 = local_64;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing DeleteReferencesRequest"
               ,(ulong)local_68,(ulong)local_70,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  if (request->referencesToDeleteSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    pUVar2 = (UA_StatusCode *)malloc(request->referencesToDeleteSize << 2);
    response->results = pUVar2;
    if (response->results == (UA_StatusCode *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      response->resultsSize = request->referencesToDeleteSize;
      for (local_58 = 0; local_58 < request->referencesToDeleteSize; local_58 = local_58 + 1) {
        UVar1 = deleteReference(server,session,request->referencesToDelete + local_58);
        response->results[local_58] = UVar1;
      }
    }
  }
  return;
}

Assistant:

void
Service_DeleteReferences(UA_Server *server, UA_Session *session,
                         const UA_DeleteReferencesRequest *request,
                         UA_DeleteReferencesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteReferencesRequest");
    if(request->referencesToDeleteSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->referencesToDeleteSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;;
        return;
    }
    response->resultsSize = request->referencesToDeleteSize;

    for(size_t i = 0; i < request->referencesToDeleteSize; ++i)
        response->results[i] =
            deleteReference(server, session, &request->referencesToDelete[i]);
}